

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,ElementCompare *compare,int start,bool type)

{
  uint uVar1;
  int iVar2;
  uint end_00;
  Element *pEVar3;
  ulong uVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  uint start_00;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  pivotkey;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  uint local_120;
  uint local_11c;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_e8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_88;
  
  uVar9 = (ulong)(uint)start;
  if (end <= start + 1) {
    return;
  }
  uVar4 = (ulong)(end - 1);
LAB_0034b9e9:
  end_00 = (uint)uVar4;
  start_00 = (uint)uVar9;
  uVar1 = end_00 - start_00;
  if ((int)uVar1 < 0x19) {
    if ((int)uVar1 < 1) {
      return;
    }
    SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
              (keys,end_00,compare,start_00);
    return;
  }
  local_e8.val.m_backend.fpclass = cpp_dec_float_finite;
  local_e8.val.m_backend.prec_elem = 0x10;
  local_e8.val.m_backend.data._M_elems[0] = 0;
  local_e8.val.m_backend.data._M_elems[1] = 0;
  local_e8.val.m_backend.data._M_elems[2] = 0;
  local_e8.val.m_backend.data._M_elems[3] = 0;
  local_e8.val.m_backend.data._M_elems[4] = 0;
  local_e8.val.m_backend.data._M_elems[5] = 0;
  local_e8.val.m_backend.data._M_elems[6] = 0;
  local_e8.val.m_backend.data._M_elems[7] = 0;
  local_e8.val.m_backend.data._M_elems[0xc] = 0;
  local_e8.val.m_backend.data._M_elems[0xd] = 0;
  local_e8.val.m_backend.data._M_elems._56_5_ = 0;
  local_e8.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_e8.val.m_backend.exp = 0;
  local_e8.val.m_backend.neg = false;
  local_e8.val.m_backend.data._M_elems[8] = 0;
  local_e8.val.m_backend.data._M_elems[9] = 0;
  local_e8.val.m_backend.data._M_elems[10] = 0;
  local_e8.val.m_backend.data._M_elems[0xb] = 0;
  local_e8.idx = 0;
  local_88.val.m_backend.fpclass = cpp_dec_float_finite;
  local_88.val.m_backend.prec_elem = 0x10;
  local_88.val.m_backend.data._M_elems[0] = 0;
  local_88.val.m_backend.data._M_elems[1] = 0;
  local_88.val.m_backend.data._M_elems[2] = 0;
  local_88.val.m_backend.data._M_elems[3] = 0;
  local_88.val.m_backend.data._M_elems[4] = 0;
  local_88.val.m_backend.data._M_elems[5] = 0;
  local_88.val.m_backend.data._M_elems[6] = 0;
  local_88.val.m_backend.data._M_elems[7] = 0;
  local_88.val.m_backend.data._M_elems[8] = 0;
  local_88.val.m_backend.data._M_elems[9] = 0;
  local_88.val.m_backend.data._M_elems[10] = 0;
  local_88.val.m_backend.data._M_elems[0xb] = 0;
  local_88.val.m_backend.data._M_elems[0xc] = 0;
  local_88.val.m_backend.data._M_elems[0xd] = 0;
  local_88.val.m_backend.data._M_elems._56_5_ = 0;
  local_88.val.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_88.val.m_backend.exp = 0;
  local_88.val.m_backend.neg = false;
  local_88.idx = 0;
  this = keys + (int)((uVar1 >> 1) + start_00);
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&local_e8,this);
  lVar8 = (long)(int)end_00;
  lVar6 = (long)(int)start_00;
  uVar10 = uVar9;
  local_11c = end_00;
  do {
    uVar1 = (uint)uVar10;
    lVar5 = (long)(int)uVar1;
    local_120 = end_00;
    if ((int)end_00 < (int)uVar1) {
      local_120 = uVar1;
    }
    if ((type & 1U) == 0) {
      uVar10 = (ulong)(int)local_11c;
      pEVar3 = keys + lVar5;
      for (; lVar5 < lVar8; lVar5 = lVar5 + 1) {
        iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::ElementCompare::operator()(compare,pEVar3,&local_e8);
        if (0 < iVar2) {
          local_120 = (uint)lVar5;
          break;
        }
        pEVar3 = pEVar3 + 1;
      }
      if ((int)start_00 <= (int)local_11c) {
        local_11c = start_00;
      }
      pEVar3 = keys + uVar10;
      for (; lVar6 < (long)uVar10; uVar10 = uVar10 - 1) {
        iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::ElementCompare::operator()(compare,pEVar3,&local_e8);
        if (iVar2 < 1) goto LAB_0034bbb5;
        pEVar3 = pEVar3 + -1;
      }
      uVar10 = (ulong)local_11c;
    }
    else {
      pEVar3 = keys + lVar5;
      for (; lVar5 < lVar8; lVar5 = lVar5 + 1) {
        iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::ElementCompare::operator()(compare,pEVar3,&local_e8);
        if (-1 < iVar2) {
          local_120 = (uint)lVar5;
          break;
        }
        pEVar3 = pEVar3 + 1;
      }
      uVar10 = (ulong)(int)local_11c;
      if ((int)start_00 <= (int)local_11c) {
        local_11c = start_00;
      }
      pEVar3 = keys + uVar10;
      for (; lVar6 < (long)uVar10; uVar10 = uVar10 - 1) {
        iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::ElementCompare::operator()(compare,pEVar3,&local_e8);
        if (iVar2 < 0) goto LAB_0034bbb5;
        pEVar3 = pEVar3 + -1;
      }
      uVar10 = (ulong)local_11c;
    }
LAB_0034bbb5:
    iVar2 = (int)uVar10;
    if (iVar2 <= (int)local_120) break;
    Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(&local_88,keys + (int)local_120);
    Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(keys + (int)local_120,keys + iVar2);
    Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(keys + iVar2,&local_88);
    uVar10 = (ulong)(local_120 + 1);
    local_11c = iVar2 - 1;
  } while( true );
  if ((type & 1U) == 0) {
    uVar11 = (ulong)iVar2;
    if ((int)start_00 <= iVar2) {
      uVar10 = uVar9;
    }
    pEVar3 = keys + uVar11;
    while ((uVar9 = uVar10, lVar6 < (long)uVar11 &&
           (iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::ElementCompare::operator()(compare,&local_e8,pEVar3), uVar9 = uVar11,
           iVar2 < 1))) {
      uVar11 = uVar11 - 1;
      pEVar3 = pEVar3 + -1;
    }
    uVar10 = uVar9 & 0xffffffff;
    if ((uint)uVar9 == end_00) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_88,keys + lVar8);
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(keys + lVar8,this);
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(this,&local_88);
      uVar10 = (ulong)(end_00 - 1);
    }
  }
  else {
    lVar5 = (long)(int)local_120;
    if ((int)local_120 <= (int)end_00) {
      local_120 = end_00;
    }
    pEVar3 = keys + lVar5;
    for (; lVar5 < lVar8; lVar5 = lVar5 + 1) {
      iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::ElementCompare::operator()(compare,&local_e8,pEVar3);
      if (iVar2 < 0) {
        local_120 = (uint)lVar5;
        break;
      }
      pEVar3 = pEVar3 + 1;
    }
    if (local_120 == start_00) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_88,keys + lVar6);
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(keys + lVar6,this);
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(this,&local_88);
      local_120 = start_00 + 1;
    }
    uVar10 = uVar10 & 0xffffffff;
  }
  uVar1 = (uint)uVar10;
  if ((int)(end_00 - local_120) < (int)(uVar1 - start_00)) {
    uVar4 = uVar10;
    uVar7 = start_00;
    uVar1 = end_00;
    start_00 = local_120;
    if ((int)end_00 <= (int)local_120) goto LAB_0034bd99;
  }
  else {
    uVar10 = uVar4;
    uVar7 = local_120;
    if ((int)uVar1 <= (int)start_00) goto LAB_0034bd99;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
            (keys,uVar1 + 1,compare,start_00,(bool)(~type & 1));
  uVar10 = uVar4;
LAB_0034bd99:
  type = (bool)(type ^ 1);
  uVar9 = (ulong)uVar7;
  uVar4 = uVar10;
  goto LAB_0034b9e9;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}